

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

uint64_t rdr_mapobs(rdr_t *rdr,char *str)

{
  long lVar1;
  char *__src;
  size_t sVar2;
  char *in_stack_00000050;
  qrk_t *in_stack_00000058;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  unsigned_long __vla_expr0;
  char *local_20;
  char *str_local;
  rdr_t *rdr_local;
  
  local_20 = str;
  str_local = &rdr->autouni;
  if ((rdr->autouni & 1U) == 0) {
    uStack_40 = 0x11321a;
    rdr_local = (rdr_t *)qrk_str2id(in_stack_00000058,in_stack_00000050);
  }
  else {
    uStack_40 = 0x113229;
    sVar2 = strlen(str);
    local_30 = sVar2 + 2;
    lVar1 = -(sVar2 + 0x11 & 0xfffffffffffffff0);
    local_38 = (undefined1 *)((long)&local_38 + lVar1);
    __vla_expr0 = (unsigned_long)&local_38;
    *local_38 = 0x75;
    __src = local_20;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113263;
    strcpy((char *)((long)&local_38 + lVar1 + 1),__src);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113274;
    rdr_local = (rdr_t *)qrk_str2id(*(qrk_t **)((long)&stack0x00000058 + lVar1),
                                    *(char **)((long)&stack0x00000050 + lVar1));
  }
  return (uint64_t)rdr_local;
}

Assistant:

static uint64_t rdr_mapobs(rdr_t *rdr, const char *str) {
	if (!rdr->autouni)
		return qrk_str2id(rdr->obs, str);
	char tmp[strlen(str) + 2];
	tmp[0] = 'u';
	strcpy(tmp + 1, str);
	return qrk_str2id(rdr->obs, tmp);
}